

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

ProcessorInstance * __thiscall
soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,ProcessorInstance *i)

{
  bool bVar1;
  ProcessorInstance *i_local;
  RewritingASTVisitor *this_local;
  
  replaceExpression(this,&i->targetProcessor);
  replaceExpression(this,&i->specialisationArgs);
  bVar1 = pool_ptr<soul::AST::Expression>::operator!=(&i->clockMultiplierRatio,(void *)0x0);
  if (bVar1) {
    replaceExpression(this,&i->clockMultiplierRatio);
  }
  bVar1 = pool_ptr<soul::AST::Expression>::operator!=(&i->clockDividerRatio,(void *)0x0);
  if (bVar1) {
    replaceExpression(this,&i->clockDividerRatio);
  }
  return i;
}

Assistant:

virtual AST::ProcessorInstance& visit (AST::ProcessorInstance& i)
    {
        replaceExpression (i.targetProcessor);
        replaceExpression (i.specialisationArgs);

        if (i.clockMultiplierRatio != nullptr)
            replaceExpression (i.clockMultiplierRatio);

        if (i.clockDividerRatio != nullptr)
            replaceExpression (i.clockDividerRatio);

        return i;
    }